

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::Triangle::CreateTriangles
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,TriangleMesh *mesh,Allocator alloc)

{
  uint uVar1;
  ulong uVar2;
  ShapeHandle *pSVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  int vb;
  size_t va;
  TriangleMesh *mesh_local;
  ulong uVar5;
  
  uVar2 = allMeshes->nStored;
  vb = -0x80000000;
  va = uVar2;
  mesh_local = mesh;
  if (uVar2 < 0xffffffff80000000) {
    pstd::
    vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
    ::push_back(allMeshes,&mesh_local);
    va = (size_t)alloc.memoryResource;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
              (__return_storage_ptr__,(long)mesh_local->nTriangles,
               (polymorphic_allocator<pbrt::ShapeHandle> *)&va);
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)mesh_local->nTriangles << 3,4);
    uVar5 = CONCAT44(extraout_var,iVar4);
    pSVar3 = __return_storage_ptr__->ptr;
    uVar1 = mesh_local->nTriangles;
    uVar7 = uVar5;
    for (uVar6 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar6; uVar6 = uVar6 + 1) {
      uVar8 = uVar7 | 0x4000000000000;
      *(int *)(uVar5 + uVar6 * 8) = (int)uVar2;
      *(int *)(uVar5 + 4 + uVar6 * 8) = (int)uVar6;
      uVar7 = uVar7 + 8;
      pSVar3[uVar6].
      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
      .bits = uVar8;
    }
    *(long *)(in_FS_OFFSET + -0x498) = *(long *)(in_FS_OFFSET + -0x498) + (long)(int)uVar1 * 8;
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
             ,0x109,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> Triangle::CreateTriangles(const TriangleMesh *mesh,
                                                    Allocator alloc) {
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());
    allMeshes->push_back(mesh);

    pstd::vector<ShapeHandle> tris(mesh->nTriangles, alloc);
    Triangle *t = alloc.allocate_object<Triangle>(mesh->nTriangles);
    for (int i = 0; i < mesh->nTriangles; ++i) {
        alloc.construct(&t[i], meshIndex, i);
        tris[i] = &t[i];
    }
    triangleBytes += mesh->nTriangles * sizeof(Triangle);
    return tris;
}